

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item_keeper.h
# Opt level: O0

void __thiscall
mp::ConstraintManager::FillConstraintCounters
          (ConstraintManager *this,BasicFlatModelAPI *mapi,FlatModelInfo *fmi)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  reference ppVar7;
  _Rb_tree_const_iterator<std::pair<const_double,_mp::BasicConstraintKeeper_&>_> *in_RDX;
  undefined8 in_RSI;
  pair<const_double,_mp::BasicConstraintKeeper_&> *ck;
  const_iterator __end2;
  const_iterator __begin2;
  map<double,_mp::BasicConstraintKeeper_&,_std::less<double>,_std::allocator<std::pair<const_double,_mp::BasicConstraintKeeper_&>_>_>
  *__range2;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  _Rb_tree_const_iterator<std::pair<const_double,_mp::BasicConstraintKeeper_&>_> *this_00;
  _Self local_30;
  _Self local_28 [2];
  _Rb_tree_const_iterator<std::pair<const_double,_mp::BasicConstraintKeeper_&>_> *local_18;
  undefined8 local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  (*(code *)in_RDX->_M_node[2]._M_right)();
  local_28[0]._M_node =
       (_Base_ptr)
       std::
       map<double,_mp::BasicConstraintKeeper_&,_std::less<double>,_std::allocator<std::pair<const_double,_mp::BasicConstraintKeeper_&>_>_>
       ::begin((map<double,_mp::BasicConstraintKeeper_&,_std::less<double>,_std::allocator<std::pair<const_double,_mp::BasicConstraintKeeper_&>_>_>
                *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  local_30._M_node =
       (_Base_ptr)
       std::
       map<double,_mp::BasicConstraintKeeper_&,_std::less<double>,_std::allocator<std::pair<const_double,_mp::BasicConstraintKeeper_&>_>_>
       ::end((map<double,_mp::BasicConstraintKeeper_&,_std::less<double>,_std::allocator<std::pair<const_double,_mp::BasicConstraintKeeper_&>_>_>
              *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  while( true ) {
    bVar1 = std::operator!=(local_28,&local_30);
    if (!bVar1) break;
    ppVar7 = std::_Rb_tree_const_iterator<std::pair<const_double,_mp::BasicConstraintKeeper_&>_>::
             operator*((_Rb_tree_const_iterator<std::pair<const_double,_mp::BasicConstraintKeeper_&>_>
                        *)0x4494f2);
    this_00 = local_18;
    iVar3 = (*ppVar7->second->_vptr_BasicConstraintKeeper[0x14])();
    iVar4 = (*ppVar7->second->_vptr_BasicConstraintKeeper[0x1c])();
    iVar5 = (*ppVar7->second->_vptr_BasicConstraintKeeper[0x15])(ppVar7->second,local_10);
    iVar6 = (*ppVar7->second->_vptr_BasicConstraintKeeper[3])();
    bVar2 = (byte)iVar6;
    iVar6 = (*ppVar7->second->_vptr_BasicConstraintKeeper[0x16])();
    (**(code **)(this_00->_M_node + 3))(this_00,iVar3,iVar4,iVar5,bVar2 & 1,iVar6);
    std::_Rb_tree_const_iterator<std::pair<const_double,_mp::BasicConstraintKeeper_&>_>::operator++
              (this_00);
  }
  return;
}

Assistant:

void FillConstraintCounters(
      const BasicFlatModelAPI& mapi, FlatModelInfo& fmi) const {
    fmi.InitConstraintCount();
    for (const auto& ck: con_keepers_) {
      fmi.AddNumberOfConstraints(
          ck.second.GetTypeInfo(),
          ck.second.GetShortTypeName(),
          ck.second.GetConstraintGroup(mapi),
          ck.second.IsLogical(),
          ck.second.GetNumberOfAddable());
    }
  }